

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O2

Uint64 efsw::Platform::System::getMaxFD(void)

{
  rlimit limit;
  
  if (getMaxFD::max_fd != 0) {
    return getMaxFD::max_fd;
  }
  getrlimit(RLIMIT_NOFILE,(rlimit *)&limit);
  getMaxFD::max_fd = limit.rlim_cur;
  return limit.rlim_cur;
}

Assistant:

Uint64 System::getMaxFD() {
	static rlim_t max_fd = 0;

	if ( max_fd == 0 ) {
		struct rlimit limit;
		getrlimit( RLIMIT_NOFILE, &limit );
		max_fd = limit.rlim_cur;
	}

	return max_fd;
}